

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::writeSequentialContainer<QList<QKeyCombination>>
          (QDataStream *s,QList<QKeyCombination> *c)

{
  ulong uVar1;
  long lVar2;
  QKeyCombination *pQVar3;
  QDataStream *this;
  int iVar4;
  long lVar5;
  
  uVar1 = (c->d).size;
  if (uVar1 >> 1 < 0x7fffffff) {
    iVar4 = (int)uVar1;
  }
  else {
    if (0x15 < *(int *)(s + 0x18)) {
      this = (QDataStream *)QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,uVar1);
      goto LAB_004158d3;
    }
    if (uVar1 != 0xfffffffe) {
      QDataStream::setStatus((Status)s);
      return s;
    }
    iVar4 = -2;
  }
  QDataStream::operator<<(s,iVar4);
LAB_004158d3:
  lVar2 = (c->d).size;
  if (lVar2 != 0) {
    pQVar3 = (c->d).ptr;
    lVar5 = 0;
    do {
      QDataStream::operator<<(s,*(int *)((long)&pQVar3->combination + lVar5));
      lVar5 = lVar5 + 4;
    } while (lVar2 << 2 != lVar5);
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}